

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzio.c
# Opt level: O0

void * luaZ_getaddr(ZIO *z,size_t n)

{
  int iVar1;
  void *res;
  size_t n_local;
  ZIO *z_local;
  
  iVar1 = checkbuffer(z);
  if (iVar1 == 0) {
    z_local = (ZIO *)0x0;
  }
  else if (z->n < n) {
    z_local = (ZIO *)0x0;
  }
  else {
    z_local = (ZIO *)z->p;
    z->n = z->n - n;
    z->p = z->p + n;
  }
  return z_local;
}

Assistant:

const void *luaZ_getaddr (ZIO* z, size_t n) {
  const void *res;
  if (!checkbuffer(z))
    return NULL;  /* no more input */
  if (z->n < n)  /* not enough bytes? */
    return NULL;  /* block not whole; cannot give an address */
  res = z->p;  /* get block address */
  z->n -= n;  /* consume these bytes */
  z->p += n;
  return res;
}